

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::mul(Vector *this,QMatrix *A,Vector *vec)

{
  int64_t iVar1;
  int64_t iVar2;
  reference pvVar3;
  Vector *in_RDX;
  QMatrix *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  real rVar4;
  int64_t i;
  size_type sVar5;
  size_type __n;
  
  iVar1 = QMatrix::getM(in_RSI);
  iVar2 = size((Vector *)0x19d906);
  if (iVar1 != iVar2) {
    __assert_fail("A.getM() == size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x5f,"void fasttext::Vector::mul(const QMatrix &, const Vector &)");
  }
  iVar1 = QMatrix::getN(in_RSI);
  iVar2 = size((Vector *)0x19d94d);
  if (iVar1 == iVar2) {
    sVar5 = 0;
    while( true ) {
      __n = sVar5;
      iVar1 = size((Vector *)0x19d998);
      if (iVar1 <= (long)sVar5) break;
      rVar4 = QMatrix::dotRow(in_RSI,in_RDX,__n);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,__n);
      *pvVar3 = rVar4;
      sVar5 = __n + 1;
    }
    return;
  }
  __assert_fail("A.getN() == vec.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x60,"void fasttext::Vector::mul(const QMatrix &, const Vector &)");
}

Assistant:

void Vector::mul(const QMatrix& A, const Vector& vec) {
  assert(A.getM() == size());
  assert(A.getN() == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}